

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transforms.c
# Opt level: O2

_Bool mat4_decompose(mat4_t m,vec3_t *scale,quat_t *rot,vec3_t *trans)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  mat3_t m_00;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  undefined8 uVar12;
  undefined4 uVar13;
  float fVar17;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 uVar18;
  float fVar20;
  undefined8 uVar19;
  undefined4 uVar21;
  undefined4 uVar22;
  quat_t qVar23;
  
  fVar11 = mat4_determinant(m);
  fVar20 = m.m[1][1];
  fVar17 = m.m[0][1];
  auVar14._0_4_ = m.m[0][0] * m.m[0][0] + fVar17 * fVar17;
  auVar14._4_4_ = m.m[1][0] * m.m[1][0] + fVar20 * fVar20;
  auVar14._8_4_ = fVar17 * fVar17 + 0.0;
  auVar14._12_4_ = fVar20 * fVar20 + 0.0;
  fVar17 = m.m[0][3];
  auVar15._4_4_ = m.m[1][3] * m.m[1][3] + m.m[1][2] * m.m[1][2] + auVar14._4_4_;
  auVar15._0_4_ = fVar17 * fVar17 + m.m[0][2] * m.m[0][2] + auVar14._0_4_;
  auVar15._8_4_ = fVar17 * fVar17 + auVar14._8_4_ + 0.0;
  auVar15._12_4_ = m.m[1][3] * m.m[1][3] + auVar14._12_4_ + 0.0;
  auVar15 = sqrtps(auVar14,auVar15);
  scale->x = (float)(int)auVar15._0_8_;
  scale->y = (float)(int)((ulong)auVar15._0_8_ >> 0x20);
  scale->z = SQRT(m.m[2][3] * m.m[2][3] +
                  m.m[2][2] * m.m[2][2] + m.m[2][0] * m.m[2][0] + m.m[2][1] * m.m[2][1]);
  trans->x = m.m[3][0];
  trans->y = m.m[3][1];
  trans->z = m.m[3][2];
  if (0.0 <= fVar11) {
    fVar11 = scale->x;
  }
  else {
    uVar1 = scale->x;
    uVar2 = scale->y;
    fVar11 = -(float)uVar1;
    scale->x = fVar11;
    scale->y = -(float)uVar2;
    scale->z = -scale->z;
  }
  bVar3 = fVar11 != 0.0;
  auVar16._4_4_ = fVar11;
  auVar16._0_4_ = fVar11;
  auVar16._8_4_ = fVar11;
  auVar16._12_4_ = fVar11;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = m._0_8_;
  auVar15 = divps(auVar8,auVar16);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = m._32_8_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = m._16_8_;
  uVar12 = auVar15._0_8_;
  if ((!bVar3) && (!NAN(fVar11))) {
    uVar12 = m._0_8_;
  }
  uVar13 = m.m[0][2] / fVar11;
  if ((!bVar3) && (!NAN(fVar11))) {
    uVar13 = m.m[0][2];
  }
  fVar11 = scale->y;
  bVar4 = fVar11 != 0.0;
  auVar6._4_4_ = fVar11;
  auVar6._0_4_ = fVar11;
  auVar6._8_4_ = fVar11;
  auVar6._12_4_ = fVar11;
  auVar15 = divps(auVar9,auVar6);
  uVar19 = auVar15._0_8_;
  if ((!bVar4) && (!NAN(fVar11))) {
    uVar19 = m._16_8_;
  }
  fVar17 = scale->z;
  uVar21 = m.m[1][2] / fVar11;
  if ((!bVar4) && (!NAN(fVar11))) {
    uVar21 = m.m[1][2];
  }
  bVar5 = fVar17 != 0.0;
  auVar7._4_4_ = fVar17;
  auVar7._0_4_ = fVar17;
  auVar7._8_4_ = fVar17;
  auVar7._12_4_ = fVar17;
  auVar15 = divps(auVar10,auVar7);
  uVar18 = auVar15._0_8_;
  if ((!bVar5) && (!NAN(fVar17))) {
    uVar18 = m._32_8_;
  }
  uVar22 = m.m[2][2] / fVar17;
  if ((!bVar5) && (!NAN(fVar17))) {
    uVar22 = m.m[2][2];
  }
  m_00.m[0][2] = (float)uVar13;
  m_00._0_8_ = uVar12;
  m_00.m[1][0] = (float)(int)uVar19;
  m_00.m[1][1] = (float)(int)((ulong)uVar19 >> 0x20);
  m_00.m[1][2] = (float)uVar21;
  m_00._24_8_ = uVar18;
  m_00.m[2][2] = (float)uVar22;
  qVar23 = quat_from_mat3(m_00);
  *rot = qVar23;
  return bVar5 && (bVar4 && bVar3);
}

Assistant:

bool
mat4_decompose(mat4_t m, vec3_t* scale, quat_t* rot, vec3_t* trans) {
    mat3_t	rot_matrix;
    bool	ret		= true;
    vec3_t	col0	= vec3(m.col[0].x, m.col[0].y, m.col[0].z);
    vec3_t	col1	= vec3(m.col[1].x, m.col[1].y, m.col[1].z);
    vec3_t	col2	= vec3(m.col[2].x, m.col[2].y, m.col[2].z);
    float	det	= mat4_determinant(m);

    *scale	= vec3(vec4_length(m.col[0]), vec4_length(m.col[1]), vec4_length(m.col[2]));
    *trans	= vec3(m.col[3].x, m.col[3].y, m.col[3].z);

    if( det < 0 )
        *scale	= vec3_neg(*scale);

    if( scale->x != 0.0f ) {
        col0	= vec3_divf(col0, scale->x);
    } else {
        ret		= false;
    }

    if( scale->y != 0.0f ) {
        col1	= vec3_divf(col1, scale->y);
    } else {
        ret		= false;
    }

    if( scale->z != 0.0f ) {
        col2	= vec3_divf(col2, scale->z);
    } else {
        ret		= false;
    }

    rot_matrix	= mat3(col0.x, col0.y, col0.z,
                   col1.x, col1.y, col1.z,
                   col2.x, col2.y, col2.z);

    *rot	= quat_from_mat3(rot_matrix);

    return ret;
}